

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O3

bool __thiscall
CppJieba::Trie::find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
          *res)

{
  pointer *pppVar1;
  pointer pTVar2;
  iterator __position;
  iterator iVar3;
  mapped_type *ppTVar4;
  ulong uVar5;
  ulong uVar6;
  mapped_type this_00;
  int iVar7;
  string local_50;
  
  if (this->_initFlag == false) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"trie not initted!","");
    Limonp::Logger::LoggingF(4,"Trie.hpp",0xd6,&local_50);
  }
  else {
    if (begin._M_current < end._M_current) {
      this_00 = this->_root;
      iVar7 = 0;
      do {
        iVar3 = std::
                _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this_00,begin._M_current);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false>.
            _M_cur == (__node_type *)0x0) break;
        ppTVar4 = std::__detail::
                  _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,begin._M_current);
        this_00 = *ppTVar4;
        if (this_00->isLeaf == true) {
          uVar5 = (ulong)this_00->nodeInfoVecPos;
          pTVar2 = (this->_nodeInfoVec).
                   super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(this->_nodeInfoVec).
                         super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
                  -0x71c71c71c71c71c7;
          if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"node\'s nodeInfoVecPos is out of _nodeInfoVec\'s range",
                       "");
            Limonp::Logger::LoggingF(4,"Trie.hpp",0xef,&local_50);
            goto LAB_001111e1;
          }
          local_50._M_string_length = (size_type)(pTVar2 + uVar5);
          local_50._M_dataplus._M_p._0_4_ = iVar7;
          __position._M_current =
               (res->
               super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (res->
              super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
            ::_M_realloc_insert<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>
                      ((vector<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>,std::allocator<std::pair<unsigned_int,CppJieba::TrieNodeInfo_const*>>>
                        *)res,__position,
                       (pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*> *)&local_50);
          }
          else {
            *(pointer *)__position._M_current = local_50._M_dataplus._M_p;
            (__position._M_current)->second = (TrieNodeInfo *)local_50._M_string_length;
            pppVar1 = &(res->
                       super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
        }
        begin._M_current = begin._M_current + 1;
        iVar7 = iVar7 + 1;
      } while (begin._M_current != end._M_current);
      return (res->
             super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (res->
             super__Vector_base<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>,_std::allocator<std::pair<unsigned_int,_const_CppJieba::TrieNodeInfo_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"begin >= end","");
    Limonp::Logger::LoggingF(4,"Trie.hpp",0xdb,&local_50);
  }
LAB_001111e1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool find(Unicode::const_iterator begin, Unicode::const_iterator end, vector<pair<uint, const TrieNodeInfo*> >& res) const
            {
                if(!_getInitFlag())
                {
                    LogFatal("trie not initted!");
                    return false;
                }
                if (begin >= end) 
                {
                    LogFatal("begin >= end");
                    return false;
                }
                TrieNode* p = _root;
                for (Unicode::const_iterator itr = begin; itr != end; itr++)
                {
                    if(p->hmap.find(*itr) == p-> hmap.end())
                    {
                        break;
                    }
                    p = p->hmap[*itr];
                    if(p->isLeaf)
                    {
                        uint pos = p->nodeInfoVecPos;
                        if(pos < _nodeInfoVec.size())
                        {
                            res.push_back(make_pair(itr-begin, &_nodeInfoVec[pos]));
                        }
                        else
                        {
                            LogFatal("node's nodeInfoVecPos is out of _nodeInfoVec's range");
                            return false;
                        }
                    }
                }
                return !res.empty();
            }